

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O1

void cmUVPipeBuffer::UVData(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  cmUVPipeBuffer *this;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  ssize_t local_10;
  
  this = (cmUVPipeBuffer *)stream->data;
  if (nread < 1) {
    if (nread < 0) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor;
      local_38._8_8_ =
           *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8);
      *(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8) = 0;
      local_28 = (this->EndFunction_).super__Function_base._M_manager;
      (this->EndFunction_).super__Function_base._M_manager = (_Manager_type)0x0;
      p_Stack_20 = (this->EndFunction_)._M_invoker;
      (this->EndFunction_)._M_invoker = (_Invoker_type)0x0;
      reset(this);
      local_10 = 0;
      if (nread != -0xfff) {
        local_10 = nread;
      }
      if (local_28 == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*p_Stack_20)(&local_38,&local_10);
      if (local_28 != (_Manager_type)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
  }
  else {
    local_38._M_unused._M_object = buf->base;
    if ((char *)local_38._M_unused._0_8_ != (char *)0x0) {
      local_38._8_8_ = (long)local_38._M_unused._0_8_ + nread;
      if ((this->DataFunction_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->DataFunction_)._M_invoker)
                ((_Any_data *)&this->DataFunction_,(cmRange<const_char_*> *)&local_38);
    }
  }
  return;
}

Assistant:

void cmUVPipeBuffer::UVData(uv_stream_t* stream, ssize_t nread,
                            const uv_buf_t* buf)
{
  auto& pipe = *reinterpret_cast<cmUVPipeBuffer*>(stream->data);
  if (nread > 0) {
    if (buf->base != nullptr) {
      // Call data function
      pipe.DataFunction_(DataRange(buf->base, buf->base + nread));
    }
  } else if (nread < 0) {
    // Save the end function on the stack before resetting the pipe
    EndFunction efunc;
    efunc.swap(pipe.EndFunction_);
    // Reset pipe before calling the end function
    pipe.reset();
    // Call end function
    efunc((nread == UV_EOF) ? 0 : nread);
  }
}